

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3SrcListFuncArgs(Parse *pParse,SrcList *p,ExprList *pList)

{
  int iVar1;
  SrcList_item *pItem;
  ExprList *pList_local;
  SrcList *p_local;
  Parse *pParse_local;
  
  if (p == (SrcList *)0x0) {
    sqlite3ExprListDelete(pParse->db,pList);
  }
  else {
    iVar1 = p->nSrc + -1;
    p->a[iVar1].u1.pFuncArg = pList;
    p->a[iVar1].fg.field_0x1 = p->a[iVar1].fg.field_0x1 & 0xfb | 4;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SrcListFuncArgs(Parse *pParse, SrcList *p, ExprList *pList){
  if( p ){
    struct SrcList_item *pItem = &p->a[p->nSrc-1];
    assert( pItem->fg.notIndexed==0 );
    assert( pItem->fg.isIndexedBy==0 );
    assert( pItem->fg.isTabFunc==0 );
    pItem->u1.pFuncArg = pList;
    pItem->fg.isTabFunc = 1;
  }else{
    sqlite3ExprListDelete(pParse->db, pList);
  }
}